

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsIPOEnabled(cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  _Base_ptr __s;
  bool bVar2;
  uint uVar3;
  char *val;
  cmake *pcVar4;
  ostream *poVar5;
  string *psVar6;
  PolicyID id;
  undefined1 local_340 [24];
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  _Base_ptr local_288;
  char *message;
  string local_270;
  string local_250;
  undefined1 local_230 [8];
  ostringstream w;
  undefined1 local_b0 [7];
  bool in_try_compile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  PolicyStatus local_70;
  PolicyStatus cmp0069;
  allocator<char> local_59;
  string local_58;
  undefined1 local_31;
  char *pcStack_30;
  bool result;
  char *feature;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  pcStack_30 = "INTERPROCEDURAL_OPTIMIZATION";
  feature = (char *)config;
  config_local = lang;
  lang_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"INTERPROCEDURAL_OPTIMIZATION",&local_59);
  val = GetFeature(this,&local_58,(string *)feature);
  bVar2 = cmSystemTools::IsOn(val);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  if (bVar2) {
    local_31 = bVar2;
    bVar2 = std::operator!=(config_local,"C");
    if (((bVar2) && (bVar2 = std::operator!=(config_local,"CXX"), bVar2)) &&
       (bVar2 = std::operator!=(config_local,"Fortran"), bVar2)) {
      this_local._7_1_ = false;
    }
    else {
      local_70 = GetPolicyStatusCMP0069(this);
      if ((local_70 == OLD) || (local_70 == WARN)) {
        pcVar1 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"_CMAKE_",config_local);
        std::operator+(&local_90,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"_IPO_LEGACY_BEHAVIOR");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)local_b0);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else if ((this->PolicyReportedCMP0069 & 1U) == 0) {
          pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          bVar2 = cmake::GetIsInTryCompile(pcVar4);
          if ((local_70 == WARN) && (!bVar2)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x45,id);
            poVar5 = std::operator<<((ostream *)local_230,(string *)&local_250);
            std::operator<<(poVar5,"\n");
            std::__cxx11::string::~string((string *)&local_250);
            poVar5 = std::operator<<((ostream *)local_230,
                                     "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
                                    );
            poVar5 = std::operator<<(poVar5,"\'");
            psVar6 = GetName_abi_cxx11_(this);
            poVar5 = std::operator<<(poVar5,(string *)psVar6);
            std::operator<<(poVar5,"\'.");
            pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
            std::__cxx11::ostringstream::str();
            GetBacktrace((cmGeneratorTarget *)&message);
            cmake::IssueMessage(pcVar4,AUTHOR_WARNING,&local_270,(cmListFileBacktrace *)&message);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&message);
            std::__cxx11::string::~string((string *)&local_270);
            this->PolicyReportedCMP0069 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_230);
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        local_288 = (_Base_ptr)0x0;
        pcVar1 = this->Makefile;
        std::operator+(&local_2c8,"_CMAKE_",config_local);
        std::operator+(&local_2a8,&local_2c8,"_IPO_SUPPORTED_BY_CMAKE");
        bVar2 = cmMakefile::IsOn(pcVar1,&local_2a8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::__cxx11::string::~string((string *)&local_2c8);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          pcVar1 = this->Makefile;
          std::operator+(&local_308,"_CMAKE_",config_local);
          std::operator+(&local_2e8,&local_308,"_IPO_MAY_BE_SUPPORTED_BY_COMPILER");
          bVar2 = cmMakefile::IsOn(pcVar1,&local_2e8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_308);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            uVar3 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
            if ((uVar3 & 1) == 0) {
              local_288 = (_Base_ptr)0x95282f;
            }
          }
          else {
            local_288 = (_Base_ptr)0x952812;
          }
        }
        else {
          local_288 = (_Base_ptr)0x9527c1;
        }
        if (local_288 == (_Base_ptr)0x0) {
          this_local._7_1_ = true;
        }
        else if ((this->PolicyReportedCMP0069 & 1U) == 0) {
          this->PolicyReportedCMP0069 = true;
          pcVar4 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
          __s = local_288;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_328,(char *)__s,(allocator<char> *)(local_340 + 0x17));
          GetBacktrace((cmGeneratorTarget *)local_340);
          cmake::IssueMessage(pcVar4,FATAL_ERROR,&local_328,(cmListFileBacktrace *)local_340);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_340);
          std::__cxx11::string::~string((string *)&local_328);
          std::allocator<char>::~allocator((allocator<char> *)(local_340 + 0x17));
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::IsIPOEnabled(std::string const& lang,
                                     std::string const& config) const
{
  const char* feature = "INTERPROCEDURAL_OPTIMIZATION";
  const bool result = cmSystemTools::IsOn(this->GetFeature(feature, config));

  if (!result) {
    // 'INTERPROCEDURAL_OPTIMIZATION' is off, no need to check policies
    return false;
  }

  if (lang != "C" && lang != "CXX" && lang != "Fortran") {
    // We do not define IPO behavior for other languages.
    return false;
  }

  cmPolicies::PolicyStatus cmp0069 = this->GetPolicyStatusCMP0069();

  if (cmp0069 == cmPolicies::OLD || cmp0069 == cmPolicies::WARN) {
    if (this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_LEGACY_BEHAVIOR")) {
      return true;
    }
    if (this->PolicyReportedCMP0069) {
      // problem is already reported, no need to issue a message
      return false;
    }
    const bool in_try_compile =
      this->LocalGenerator->GetCMakeInstance()->GetIsInTryCompile();
    if (cmp0069 == cmPolicies::WARN && !in_try_compile) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0069) << "\n";
      w << "INTERPROCEDURAL_OPTIMIZATION property will be ignored for target "
        << "'" << this->GetName() << "'.";
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING, w.str(), this->GetBacktrace());

      this->PolicyReportedCMP0069 = true;
    }
    return false;
  }

  // Note: check consistency with messages from CheckIPOSupported
  const char* message = nullptr;
  if (!this->Makefile->IsOn("_CMAKE_" + lang + "_IPO_SUPPORTED_BY_CMAKE")) {
    message = "CMake doesn't support IPO for current compiler";
  } else if (!this->Makefile->IsOn("_CMAKE_" + lang +
                                   "_IPO_MAY_BE_SUPPORTED_BY_COMPILER")) {
    message = "Compiler doesn't support IPO";
  } else if (!this->GlobalGenerator->IsIPOSupported()) {
    message = "CMake doesn't support IPO for current generator";
  }

  if (!message) {
    // No error/warning messages
    return true;
  }

  if (this->PolicyReportedCMP0069) {
    // problem is already reported, no need to issue a message
    return false;
  }

  this->PolicyReportedCMP0069 = true;

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, message, this->GetBacktrace());
  return false;
}